

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O2

void __thiscall Js::DelayedFreeArrayBuffer::ResetToNoMarkObject(DelayedFreeArrayBuffer *this)

{
  Type pAVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *ppAVar5;
  Iterator local_40;
  
  local_40.list =
       (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
       this;
  local_40.current = (NodeBase *)this;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if ((SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
        this == (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_009fe86a;
      *puVar4 = 0;
      this = (DelayedFreeArrayBuffer *)local_40.current;
    }
    local_40.current =
         (((DelayedFreeBufferType *)
          &((SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
             *)this)->super_SListNodeBase<Memory::HeapAllocator>)->
         super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
         ).super_SListNodeBase<Memory::HeapAllocator>.next;
    if ((SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
        local_40.current == local_40.list) {
      return;
    }
    ppAVar5 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
              ::Iterator::Data(&local_40);
    pAVar1 = *ppAVar5;
    if (pAVar1 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DelayFreeArrayBufferHelper.cpp"
                                  ,0x18,"(item != nullptr)","item != nullptr");
      if (!bVar3) {
LAB_009fe86a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[5])(pAVar1,0);
    this = (DelayedFreeArrayBuffer *)local_40.current;
  } while( true );
}

Assistant:

void Js::DelayedFreeArrayBuffer::ResetToNoMarkObject()
    {
        this->listOfBuffers.Map([](Js::ArrayBufferContentForDelayedFreeBase* item) {
            Assert(item != nullptr);
            item->SetMarkBit(false);
        });
    }